

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

static_huffman_data_model * __thiscall
crnlib::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  decoder_tables *pdVar1;
  static_huffman_data_model *rhs_local;
  static_huffman_data_model *this_local;
  
  if (this != rhs) {
    this->m_total_syms = rhs->m_total_syms;
    vector<unsigned_short>::operator=(&this->m_codes,&rhs->m_codes);
    pdVar1 = (decoder_tables *)&rhs->m_code_sizes;
    vector<unsigned_char>::operator=(&this->m_code_sizes,(vector<unsigned_char> *)pdVar1);
    if (rhs->m_pDecode_tables == (decoder_tables *)0x0) {
      crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (this->m_pDecode_tables == (decoder_tables *)0x0) {
      pdVar1 = crnlib_new<crnlib::prefix_coding::decoder_tables,crnlib::prefix_coding::decoder_tables>
                         ((crnlib *)rhs->m_pDecode_tables,pdVar1);
      this->m_pDecode_tables = pdVar1;
    }
    else {
      prefix_coding::decoder_tables::operator=(this->m_pDecode_tables,rhs->m_pDecode_tables);
    }
    this->m_encoding = (bool)(rhs->m_encoding & 1);
  }
  return this;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs) {
  if (this == &rhs)
    return *this;

  m_total_syms = rhs.m_total_syms;
  m_codes = rhs.m_codes;
  m_code_sizes = rhs.m_code_sizes;

  if (rhs.m_pDecode_tables) {
    if (m_pDecode_tables)
      *m_pDecode_tables = *rhs.m_pDecode_tables;
    else
      m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
  } else {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }

  m_encoding = rhs.m_encoding;

  return *this;
}